

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefinePropertyDesc(JSContext *ctx,JSValue obj,JSAtom prop,JSValue desc,int flags)

{
  int iVar1;
  int ret;
  JSPropertyDescriptor d;
  undefined4 in_stack_00000068;
  JSAtom in_stack_0000015c;
  JSContext *in_stack_00000160;
  undefined1 in_stack_00000168 [16];
  undefined1 in_stack_00000178 [16];
  JSValue in_stack_00000290;
  JSValue in_stack_000002a0;
  int in_stack_000002b0;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_c;
  
  iVar1 = js_obj_to_desc(ctx,(JSPropertyDescriptor *)CONCAT44(prop,in_stack_00000068),desc);
  if (iVar1 < 0) {
    local_c = -1;
  }
  else {
    local_c = JS_DefineProperty(in_stack_00000160,(JSValue)in_stack_00000178,in_stack_0000015c,
                                (JSValue)in_stack_00000168,in_stack_00000290,in_stack_000002a0,
                                in_stack_000002b0);
    js_free_desc(local_58,local_60);
  }
  return local_c;
}

Assistant:

static __exception int JS_DefinePropertyDesc(JSContext *ctx, JSValueConst obj,
                                             JSAtom prop, JSValueConst desc,
                                             int flags)
{
    JSPropertyDescriptor d;
    int ret;

    if (js_obj_to_desc(ctx, &d, desc) < 0)
        return -1;

    ret = JS_DefineProperty(ctx, obj, prop,
                            d.value, d.getter, d.setter, d.flags | flags);
    js_free_desc(ctx, &d);
    return ret;
}